

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O0

void convertMidiFileToSvg(stringstream *output,MidiFile *midifile,Options *options)

{
  vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_> *pvVar1;
  Options *pOVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  MidiEventList *pMVar7;
  reference pvVar8;
  MidiEvent *pMVar9;
  double totalduration;
  double dVar10;
  string local_288 [36];
  int local_264;
  int local_260;
  int j_1;
  int i_1;
  int j;
  int i;
  int track;
  int maxpitch;
  int minpitch;
  vector<double,_std::allocator<double>_> trackhues;
  string local_228;
  double local_208;
  double strokewidth;
  string local_1f8;
  undefined1 local_1d8 [8];
  string strokecolor;
  stringstream local_1a8 [8];
  stringstream notes;
  ostream local_198 [376];
  Options *local_20;
  Options *options_local;
  MidiFile *midifile_local;
  stringstream *output_local;
  
  local_20 = options;
  options_local = (Options *)midifile;
  midifile_local = (MidiFile *)output;
  smf::MidiFile::linkNotePairs(midifile);
  smf::MidiFile::doTimeAnalysis((MidiFile *)options_local);
  std::__cxx11::stringstream::stringstream(local_1a8);
  dVar10 = StaffThickness;
  if (staffQ != 0) {
    totalduration = smf::MidiFile::getFileDurationInSeconds((MidiFile *)options_local);
    drawStaves(local_198,dVar10,&StaffColor_abi_cxx11_,totalduration);
    if (clefQ != 0) {
      drawClefs(local_198);
    }
    if (braceQ != 0) {
      drawBrace(local_198);
    }
  }
  pOVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"stroke-color",(allocator *)((long)&strokewidth + 7));
  smf::Options::getString((string *)local_1d8,pOVar2,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&strokewidth + 7));
  pOVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"stroke-width",
             (allocator *)
             ((long)&trackhues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  dVar10 = smf::Options::getDouble(pOVar2,&local_228);
  dVar10 = dVar10 * Scale;
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&trackhues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_208 = dVar10;
  poVar6 = std::operator<<(local_198,"\t<g");
  poVar6 = std::operator<<(poVar6," style=\"");
  poVar6 = std::operator<<(poVar6,"stroke-width:");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_208);
  poVar6 = std::operator<<(poVar6,";");
  poVar6 = std::operator<<(poVar6," stroke:");
  poVar6 = std::operator<<(poVar6,(string *)local_1d8);
  poVar6 = std::operator<<(poVar6,";");
  poVar6 = std::operator<<(poVar6,"\"");
  std::operator<<(poVar6,">\n");
  getTrackHues((vector<double,_std::allocator<double>_> *)&maxpitch,(MidiFile *)options_local);
  if (lineQ != 0) {
    drawLines(local_198,(MidiFile *)options_local,
              (vector<double,_std::allocator<double>_> *)&maxpitch,local_20);
  }
  track = 0;
  i = 0;
  j = 0;
  if (bwQ == 0) {
    i_1 = smf::MidiFile::size((MidiFile *)options_local);
    while (i_1 = i_1 + -1, -1 < i_1) {
      pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,i_1);
      iVar4 = hasNotes(pMVar7);
      if (iVar4 != 0) {
        pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,i_1);
        getMinMaxTrackPitch(pMVar7,&track,&i);
        j = i_1;
        poVar6 = std::operator<<(local_198,"\t\t<g");
        std::operator<<(poVar6," opacity=\"0.5\"");
        poVar6 = std::operator<<(local_198," class=\"note-backdrops ");
        poVar6 = std::operator<<(poVar6,"track-");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,i_1);
        std::operator<<(poVar6,"\"");
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&maxpitch,(long)i_1);
        if (0.0 <= *pvVar8) {
          if (bwQ == 0) {
            if (darkQ == 0) {
              poVar6 = std::operator<<(local_198," style=\"");
              poVar6 = std::operator<<(poVar6,"fill:black;");
              std::operator<<(poVar6,"\"");
            }
            else {
              poVar6 = std::operator<<(local_198," style=\"");
              poVar6 = std::operator<<(poVar6,"fill:white;");
              std::operator<<(poVar6,"\"");
            }
          }
          else {
            poVar6 = std::operator<<(local_198," style=\"");
            poVar6 = std::operator<<(poVar6,"fill:none;");
            std::operator<<(poVar6,"\"");
          }
        }
        std::operator<<(local_198," >\n");
        j_1 = 0;
        while( true ) {
          iVar4 = j_1;
          pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,i_1);
          iVar5 = smf::MidiEventList::size(pMVar7);
          if (iVar5 <= iVar4) break;
          pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,i_1);
          pMVar9 = smf::MidiEventList::operator[](pMVar7,j_1);
          bVar3 = smf::MidiMessage::isNoteOn(&pMVar9->super_MidiMessage);
          if (bVar3) {
            if ((drumQ == 0.0) && (!NAN(drumQ))) {
              pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,i_1);
              pMVar9 = smf::MidiEventList::operator[](pMVar7,j_1);
              iVar4 = smf::MidiMessage::getChannel(&pMVar9->super_MidiMessage);
              if (iVar4 == 9) goto LAB_0013ed5d;
            }
            drawNote(local_198,(MidiFile *)options_local,i_1,j_1,0,track,i);
          }
LAB_0013ed5d:
          j_1 = j_1 + 1;
        }
        std::operator<<(local_198,"\t\t</g>\n");
      }
    }
  }
  local_260 = smf::MidiFile::size((MidiFile *)options_local);
  do {
    do {
      local_260 = local_260 + -1;
      if (local_260 < 0) {
        std::operator<<(local_198,"\t</g>\n");
        pvVar1 = &midifile_local->m_events;
        std::__cxx11::stringstream::str();
        std::operator<<((ostream *)
                        &(pvVar1->
                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage,local_288);
        std::__cxx11::string::~string(local_288);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)&maxpitch);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::stringstream::~stringstream(local_1a8);
        return;
      }
      pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,local_260);
      iVar4 = hasNotes(pMVar7);
    } while (iVar4 == 0);
    j = local_260;
    pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,local_260);
    getMinMaxTrackPitch(pMVar7,&track,&i);
    poVar6 = std::operator<<(local_198,"\t\t<g");
    poVar6 = std::operator<<(poVar6," class=\"track-");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,j);
    std::operator<<(poVar6,"\"");
    if ((transparentQ != 0) && (bwQ == 0)) {
      std::operator<<(local_198," filter=\"url(#constantOpacity)\"");
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&maxpitch,(long)local_260);
    if (0.0 <= *pvVar8) {
      if (bwQ == 0) {
        poVar6 = std::operator<<(local_198," style=\"");
        poVar6 = std::operator<<(poVar6,"opacity:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,Opacity);
        poVar6 = std::operator<<(poVar6,";");
        poVar6 = std::operator<<(poVar6," fill:hsl(");
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&maxpitch,(long)local_260);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar8);
        poVar6 = std::operator<<(poVar6,", 100%, 75%);");
        std::operator<<(poVar6,"\"");
      }
      else {
        poVar6 = std::operator<<(local_198," style=\"");
        poVar6 = std::operator<<(poVar6," fill:white;");
        std::operator<<(poVar6,"\"");
      }
    }
    std::operator<<(local_198," >\n");
    local_264 = 0;
    while( true ) {
      iVar4 = local_264;
      pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,local_260);
      iVar5 = smf::MidiEventList::size(pMVar7);
      if (iVar5 <= iVar4) break;
      pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,local_260);
      pMVar9 = smf::MidiEventList::operator[](pMVar7,local_264);
      bVar3 = smf::MidiMessage::isNoteOn(&pMVar9->super_MidiMessage);
      if (bVar3) {
        if ((drumQ == 0.0) && (!NAN(drumQ))) {
          pMVar7 = smf::MidiFile::operator[]((MidiFile *)options_local,local_260);
          pMVar9 = smf::MidiEventList::operator[](pMVar7,local_264);
          iVar4 = smf::MidiMessage::getChannel(&pMVar9->super_MidiMessage);
          if (iVar4 == 9) goto LAB_0013f1ac;
        }
        drawNote(local_198,(MidiFile *)options_local,local_260,local_264,dataQ,track,i);
      }
LAB_0013f1ac:
      local_264 = local_264 + 1;
    }
    std::operator<<(local_198,"\t\t</g>\n");
  } while( true );
}

Assistant:

void convertMidiFileToSvg(stringstream& output, MidiFile& midifile,
		Options& options) {

	midifile.linkNotePairs();    // first link note-ons to note-offs
	midifile.doTimeAnalysis();   // then create ticks to seconds mapping

	stringstream notes;

	if (staffQ) {
		drawStaves(notes, StaffThickness, StaffColor,
				midifile.getFileDurationInSeconds());
		if (clefQ) {
			drawClefs(notes);
		}
		if (braceQ) {
			drawBrace(notes);
		}
	}

	string strokecolor = options.getString("stroke-color");
	double strokewidth = options.getDouble("stroke-width") * Scale;
	notes << "\t<g"
	      << " style=\""
	      <<   "stroke-width:" << strokewidth << ";"
	      <<   " stroke:" << strokecolor << ";"
	      << "\""
	      << ">\n";

	vector<double> trackhues = getTrackHues(midifile);

	if (lineQ) {
		drawLines(notes, midifile, trackhues, options);
	}

	int minpitch = 0;
	int maxpitch = 0;

	// Draw background for increasing contrast of notes and background
	// (needed due to constant opacity filter):
	int track = 0;
	if (!bwQ) {
		for (int i=midifile.size()-1; i>=0; i--) {
			if (!hasNotes(midifile[i])) {
				continue;
			}
			getMinMaxTrackPitch(midifile[i], minpitch, maxpitch);
			track = i;
			notes << "\t\t<g"
					<< " opacity=\"0.5\"";
			notes << " class=\"note-backdrops " << "track-" << i << "\"";
			if (trackhues[i] >= 0.0) {
				if (bwQ) {
					notes << " style=\""
					      << "fill:none;"
					      << "\"";
				 } else if (darkQ) {
					notes << " style=\""
					      << "fill:white;"
					      << "\"";
				 } else {
					notes << " style=\""
					      << "fill:black;"
					      << "\"";
				 }
			}
			notes << " >\n";
			for (int j=0; j<midifile[i].size(); j++) {
				if (!midifile[i][j].isNoteOn()) {
					continue;
				}
				if (!drumQ) {
					if (midifile[i][j].getChannel() == 0x09) {
						continue;
					}
				}
				drawNote(notes, midifile, i, j, 0, minpitch, maxpitch);
			}
			notes << "\t\t</g>\n";
		}
	}

	// draw the actual notes:
	for (int i=midifile.size()-1; i>=0; i--) {
		if (!hasNotes(midifile[i])) {
			continue;
		}
		track = i;
		getMinMaxTrackPitch(midifile[i], minpitch, maxpitch);
		notes << "\t\t<g"
		      << " class=\"track-" << track << "\"";
		if (transparentQ && !bwQ) {
			notes << " filter=\"url(#constantOpacity)\"";
		}
		if (trackhues[i] >= 0.0) {
			if (bwQ) {
				notes << " style=\""
				      << " fill:white;"
				      << "\"";
			} else {
				notes << " style=\""
				      << "opacity:" << Opacity << ";"
				      << " fill:hsl(" << trackhues[i] << ", 100%, 75%);"
				      << "\"";
			}
		}
		notes << " >\n";

		for (int j=0; j<midifile[i].size(); j++) {
			if (!midifile[i][j].isNoteOn()) {
				continue;
			}
			if (!drumQ) {
				if (midifile[i][j].getChannel() == 0x09) {
					continue;
				}
			}

			drawNote(notes, midifile, i, j, dataQ, minpitch, maxpitch);
		}
		notes << "\t\t</g>\n";
	}
	notes << "\t</g>\n";

	output << notes.str();
}